

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

size_t Assimp::Write<aiColor3D>(IOStream *stream,aiColor3D *v)

{
  (*stream->_vptr_IOStream[3])(stream,v,4,1);
  (*stream->_vptr_IOStream[3])(stream,&v->g,4,1);
  (*stream->_vptr_IOStream[3])(stream,&v->b,4,1);
  return 0xc;
}

Assistant:

inline
size_t Write<aiColor3D>(IOStream * stream, const aiColor3D& v) {
    size_t t = Write<float>(stream,v.r);
    t += Write<float>(stream,v.g);
    t += Write<float>(stream,v.b);

    return t;
}